

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O3

void __thiscall CArmArchitecture::Pass2(CArmArchitecture *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ArmPool *pAVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = this->PoolCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x810),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(0x810),0);
  }
  pAVar3 = (ArmPool *)operator_new__(uVar4);
  if (uVar1 != 0) {
    lVar5 = 0;
    do {
      ArmPool::ArmPool((ArmPool *)((long)pAVar3->Entries + lVar5));
      lVar5 = lVar5 + 0x810;
    } while (uVar1 * 0x810 - lVar5 != 0);
  }
  this->Pools = pAVar3;
  this->CurrentPool = 0;
  return;
}

Assistant:

void CArmArchitecture::Pass2()
{
	Pools = new ArmPool[PoolCount];
	CurrentPool = 0;
}